

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall
QDockAreaLayoutInfo::tab(QDockAreaLayoutInfo *this,int index,QLayoutItem *dockWidgetItem)

{
  QDockAreaLayoutInfo *this_00;
  reference pQVar1;
  const_reference pQVar2;
  QLayoutItem *in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  QDockAreaLayoutInfo *new_info;
  rvalue_ref in_stack_ffffffffffffff28;
  QDockAreaLayoutInfo *t;
  QDockAreaLayoutInfo *in_stack_ffffffffffffff30;
  QDockAreaLayoutInfo *this_01;
  undefined8 in_stack_ffffffffffffff38;
  int tbshape;
  QDockAreaLayoutItem *in_stack_ffffffffffffff40;
  QDockAreaLayoutItem *this_02;
  int *in_stack_ffffffffffffff48;
  QDockAreaLayoutInfo *in_stack_ffffffffffffff50;
  QDockAreaLayoutItem local_80;
  QDockAreaLayoutInfo *in_stack_ffffffffffffffc0;
  QDockAreaLayoutItem local_30;
  long local_8;
  
  tbshape = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI + 0x58) & 1) == 0) {
    this_00 = (QDockAreaLayoutInfo *)operator_new(0x70);
    QDockAreaLayoutInfo(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                        (DockPosition)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                        (Orientation)in_stack_ffffffffffffff40,tbshape,
                        (QMainWindow *)in_stack_ffffffffffffff30);
    t = this_00;
    this_01 = this_00;
    pQVar1 = QList<QDockAreaLayoutItem>::operator[]
                       ((QList<QDockAreaLayoutItem> *)this_00,(qsizetype)this_00);
    pQVar1->subinfo = this_01;
    pQVar2 = QList<QDockAreaLayoutItem>::at((QList<QDockAreaLayoutItem> *)this_01,(qsizetype)t);
    QDockAreaLayoutItem::QDockAreaLayoutItem
              ((QDockAreaLayoutItem *)&stack0xffffffffffffffa8,pQVar2->widgetItem);
    QList<QDockAreaLayoutItem>::append((QList<QDockAreaLayoutItem> *)this_01,(rvalue_ref)t);
    QDockAreaLayoutItem::~QDockAreaLayoutItem(in_stack_ffffffffffffff40);
    pQVar1 = QList<QDockAreaLayoutItem>::operator[]
                       ((QList<QDockAreaLayoutItem> *)this_01,(qsizetype)t);
    pQVar1->widgetItem = (QLayoutItem *)0x0;
    this_02 = (QDockAreaLayoutItem *)&this_00->item_list;
    QDockAreaLayoutItem::QDockAreaLayoutItem(&local_80,in_RDX);
    QList<QDockAreaLayoutItem>::append((QList<QDockAreaLayoutItem> *)this_01,(rvalue_ref)t);
    QDockAreaLayoutItem::~QDockAreaLayoutItem(this_02);
    this_00->tabbed = true;
    updateTabBar(in_stack_ffffffffffffffc0);
    (*in_RDX->_vptr_QLayoutItem[0xd])();
    setCurrentTab(this_01,(QWidget *)t);
  }
  else {
    QDockAreaLayoutItem::QDockAreaLayoutItem(&local_30,in_RDX);
    QList<QDockAreaLayoutItem>::append
              ((QList<QDockAreaLayoutItem> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    QDockAreaLayoutItem::~QDockAreaLayoutItem(in_stack_ffffffffffffff40);
    updateTabBar(in_stack_ffffffffffffffc0);
    (*in_RDX->_vptr_QLayoutItem[0xd])();
    setCurrentTab(in_stack_ffffffffffffff30,(QWidget *)in_stack_ffffffffffffff28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayoutInfo::tab(int index, QLayoutItem *dockWidgetItem)
{
    if (tabbed) {
        item_list.append(QDockAreaLayoutItem(dockWidgetItem));
        updateTabBar();
        setCurrentTab(dockWidgetItem->widget());
    } else {
        QDockAreaLayoutInfo *new_info
            = new QDockAreaLayoutInfo(sep, dockPos, o, tabBarShape, mainWindow);
        item_list[index].subinfo = new_info;
        new_info->item_list.append(QDockAreaLayoutItem(item_list.at(index).widgetItem));
        item_list[index].widgetItem = nullptr;
        new_info->item_list.append(QDockAreaLayoutItem(dockWidgetItem));
        new_info->tabbed = true;
        new_info->updateTabBar();
        new_info->setCurrentTab(dockWidgetItem->widget());
    }
}